

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmmulticast.c
# Opt level: O1

int libcmmulticast_LTX_writev_func
              (CMtrans_services_conflict svc,mcast_conn_data_ptr mcd,iovec *iov,int iovcnt,
              attr_list attrs)

{
  ushort uVar1;
  ushort *puVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  uint *puVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  in_addr_t iVar12;
  ssize_t sVar13;
  char *pcVar14;
  char *pcVar15;
  hostent *phVar16;
  void *__ptr;
  msghdr *__message;
  ulong uVar17;
  long **pplVar18;
  void *pvVar19;
  uint uVar20;
  ulong uVar21;
  char **ppcVar22;
  bool bVar23;
  uint nl;
  sockaddr_in addr;
  msghdr msg;
  long *plStack_208;
  int aiStack_200 [2];
  void *pvStack_1f8;
  char acStack_1f0 [48];
  char acStack_1c0 [264];
  ulong uStack_b8;
  iovec *piStack_b0;
  undefined4 *puStack_a8;
  mcast_conn_data_ptr pmStack_a0;
  CMtrans_services_conflict pCStack_98;
  code *pcStack_90;
  socklen_t local_7c;
  undefined4 local_78;
  in_addr_t iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  msghdr local_68;
  
  uVar20 = mcd->output_fd;
  uVar21 = (ulong)uVar20;
  local_78._0_2_ = (mcd->output_addr).sin_family;
  local_78._2_2_ = (mcd->output_addr).sin_port;
  iStack_74 = (mcd->output_addr).sin_addr.s_addr;
  uStack_70 = *(undefined4 *)(mcd->output_addr).sin_zero;
  uStack_6c = *(undefined4 *)((mcd->output_addr).sin_zero + 4);
  pcStack_90 = (code *)0x101d6e;
  (*svc->trace_out)(mcd->mtd->cm,"CMMcast writev of %d vectors on fd %d",(ulong)(uint)iovcnt,uVar21)
  ;
  __message = &local_68;
  local_68.msg_control = (void *)0x0;
  local_68.msg_controllen = 0;
  local_68.msg_flags = 0;
  local_68._52_4_ = 0;
  local_68.msg_namelen = 0x10;
  local_68._12_4_ = 0;
  local_68.msg_iovlen = (size_t)iovcnt;
  uVar17 = (ulong)uVar20;
  pcStack_90 = (code *)0x101da7;
  local_68.msg_name = &local_78;
  local_68.msg_iov = (iovec *)iov;
  sVar13 = sendmsg(uVar20,__message,0);
  if (-1 < sVar13) {
    if ((mcd->my_addr).sin_port == 0) {
      pcStack_90 = (code *)0x101dc2;
      uVar9 = get_self_ip_addr((void *)0x0,svc);
      local_7c = 0x10;
      pcStack_90 = (code *)0x101dda;
      iVar10 = getsockname(uVar20,(sockaddr *)&mcd->my_addr,&local_7c);
      if (iVar10 != 0) {
        pcStack_90 = (code *)0x101e02;
        perror("getsockname");
      }
      (mcd->my_addr).sin_addr.s_addr =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    }
    return iovcnt;
  }
  pcStack_90 = get_self_ip_addr;
  libcmmulticast_LTX_writev_func_cold_1();
  pplVar18 = &plStack_208;
  plStack_208 = (long *)0x0;
  uStack_b8 = (ulong)(uint)iovcnt;
  piStack_b0 = iov;
  puStack_a8 = &local_78;
  pmStack_a0 = mcd;
  pCStack_98 = svc;
  pcStack_90 = (code *)uVar21;
  iVar10 = getifaddrs(pplVar18);
  plVar5 = plStack_208;
  if (iVar10 == 0) {
    for (; plVar5 != (long *)0x0; plVar5 = (long *)*plVar5) {
      puVar2 = (ushort *)plVar5[3];
      if (puVar2 != (ushort *)0x0) {
        uVar1 = *puVar2;
        if ((uVar1 & 0xfff7) == 2 && __message != (msghdr *)0x0) {
          pcVar3 = *(code **)&__message->msg_flags;
          lVar4 = plVar5[1];
          pcVar14 = inet_ntop((uint)uVar1,puVar2 + (ulong)(uVar1 != 2) * 2 + 2,acStack_1f0,0x2e);
          (*pcVar3)(uVar17,"CM<transport> IP possibility -> %s : %s",lVar4,pcVar14);
        }
      }
    }
    pcVar14 = getenv("CM_INTERFACE");
    uVar21 = 0;
    if (pcVar14 == (char *)0x0) {
LAB_00101f72:
      gethostname(acStack_1c0,0x100);
      phVar16 = gethostbyname(acStack_1c0);
      if (phVar16 != (hostent *)0x0) {
        ppcVar22 = phVar16->h_addr_list;
        puVar7 = (uint *)*ppcVar22;
        while (puVar7 != (uint *)0x0) {
          ppcVar22 = ppcVar22 + 1;
          uVar20 = *puVar7;
          if ((char)uVar20 != '\x7f') {
            if (__message != (msghdr *)0x0) {
              (**(code **)&__message->msg_flags)
                        (uVar17,
                         "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
                         (char)*puVar7,*(char *)((long)puVar7 + 1),*(char *)((long)puVar7 + 2),
                         *(char *)((long)puVar7 + 3));
            }
            freeifaddrs(plStack_208);
            uVar9 = *puVar7;
            uVar21 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                            uVar9 << 0x18);
          }
          if ((char)uVar20 != '\x7f') goto LAB_00101f57;
          puVar7 = (uint *)*ppcVar22;
        }
      }
      pplVar18 = &plStack_208;
      do {
        pplVar18 = (long **)*pplVar18;
        bVar23 = pplVar18 == (long **)0x0;
        if (bVar23) break;
        plVar5 = pplVar18[3];
        bVar8 = true;
        if (((plVar5 != (long *)0x0) && ((short)*plVar5 == 2)) && (((ulong)pplVar18[2] & 8) == 0)) {
          if (__message != (msghdr *)0x0) {
            pcVar3 = *(code **)&__message->msg_flags;
            plVar6 = pplVar18[1];
            pcVar14 = inet_ntop(2,(uint *)((long)plVar5 + 4),acStack_1f0,0x2e);
            (*pcVar3)(uVar17,"CM<transport> get_self_ip_addr returning first avail -> %s : %s",
                      plVar6,pcVar14);
          }
          uVar20 = *(uint *)((long)plVar5 + 4);
          uVar21 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18);
          freeifaddrs(plStack_208);
          bVar8 = false;
        }
      } while (bVar8);
    }
    else {
      do {
        pplVar18 = (long **)*pplVar18;
        if (pplVar18 == (long **)0x0) {
          printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n"
                 ,pcVar14);
          goto LAB_00101f72;
        }
        plVar5 = pplVar18[3];
        bVar23 = true;
        if ((plVar5 != (long *)0x0) && ((short)*plVar5 == 2)) {
          plVar6 = pplVar18[1];
          iVar10 = strcmp((char *)plVar6,pcVar14);
          if (iVar10 == 0) {
            if (__message != (msghdr *)0x0) {
              pcVar3 = *(code **)&__message->msg_flags;
              pcVar15 = inet_ntop(2,(uint *)((long)plVar5 + 4),acStack_1f0,0x2e);
              (*pcVar3)(uVar17,"CM<transport> Interface specified, returning ->%s : %s",plVar6,
                        pcVar15);
            }
            freeifaddrs(plStack_208);
            uVar20 = *(uint *)((long)plVar5 + 4);
            uVar21 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                            uVar20 << 0x18);
            bVar23 = false;
          }
        }
      } while (bVar23);
LAB_00101f57:
      bVar23 = false;
    }
    if (!bVar23) {
      return (int)uVar21;
    }
  }
  if (plStack_208 != (long *)0x0) {
    freeifaddrs();
  }
  gethostname(acStack_1c0,0x100);
  phVar16 = gethostbyname(acStack_1c0);
  if (phVar16 != (hostent *)0x0) {
    ppcVar22 = phVar16->h_addr_list;
    puVar7 = (uint *)*ppcVar22;
    while (puVar7 != (uint *)0x0) {
      ppcVar22 = ppcVar22 + 1;
      uVar20 = *puVar7;
      uVar9 = uVar20 << 0x18;
      if (uVar9 != 0x7f000000) {
        if (__message != (msghdr *)0x0) {
          (**(code **)&__message->msg_flags)
                    (uVar17,"CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",
                     uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar9,
                     (char)*puVar7,*(undefined1 *)((long)puVar7 + 1),
                     *(undefined1 *)((long)puVar7 + 2),*(undefined1 *)((long)puVar7 + 3));
        }
        uVar20 = *puVar7;
        uVar21 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
      }
      if (uVar9 != 0x7f000000) {
        return (int)uVar21;
      }
      puVar7 = (uint *)*ppcVar22;
    }
  }
  iVar12 = 0;
  iVar10 = socket(2,2,0);
  aiStack_200[0] = 0xa00;
  __ptr = malloc(0xa00);
  pvStack_1f8 = __ptr;
  iVar11 = ioctl(iVar10,0x8912,aiStack_200);
  if ((-1 < iVar11) &&
     (uVar21 = (ulong)(long)aiStack_200[0] / 0x28, pvVar19 = pvStack_1f8, (int)uVar21 != 0)) {
    do {
      ioctl(iVar10,0x8913,pvVar19);
      uVar1 = *(ushort *)((long)pvVar19 + 0x10);
      if ((uVar1 & 8) == 0) {
        if ((uVar1 & 1) == 0) {
          pcVar14 = "CM<transport> - Get self IP addr %lx, rejected, not UP";
          goto LAB_001021e3;
        }
        if ((uVar1 & 0x40) == 0) {
          pcVar14 = "CM<transport> - Get self IP addr %lx, rejected, not RUNNING";
          goto LAB_001021e3;
        }
        uVar20 = *(uint *)((long)pvVar19 + 0x14);
        if ((uVar20 != 0) && (uVar20 != 0x7f000001)) {
          iVar12 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                   uVar20 << 0x18;
          if (__message != (msghdr *)0x0) {
            (**(code **)&__message->msg_flags)
                      (uVar17,"CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",iVar12,
                       *(undefined1 *)((long)pvVar19 + 0x14),*(undefined1 *)((long)pvVar19 + 0x15),
                       *(undefined1 *)((long)pvVar19 + 0x16),*(undefined1 *)((long)pvVar19 + 0x17));
          }
          goto LAB_00102263;
        }
      }
      else {
        pcVar14 = "CM<transport> - Get self IP addr %lx, rejected, loopback";
LAB_001021e3:
        if (__message != (msghdr *)0x0) {
          uVar20 = *(uint *)((long)pvVar19 + 0x14);
          (**(code **)&__message->msg_flags)
                    (uVar17,pcVar14,
                     uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
        }
      }
      uVar20 = (int)uVar21 - 1;
      uVar21 = (ulong)uVar20;
      pvVar19 = (void *)((long)pvVar19 + 0x28);
    } while (uVar20 != 0);
    iVar12 = 0;
  }
LAB_00102263:
  close(iVar10);
  free(__ptr);
  if (iVar12 == 0) {
    pcVar14 = getenv("CM_LAST_RESORT_IP_ADDR");
    if (__message != (msghdr *)0x0) {
      (**(code **)&__message->msg_flags)(uVar17,"CM<transport> - Get self IP addr at last resort");
    }
    if (pcVar14 == (char *)0x0) {
      iVar12 = 0;
    }
    else {
      if (__message != (msghdr *)0x0) {
        (**(code **)&__message->msg_flags)
                  (uVar17,"CM<transport> - Translating last resort %s",pcVar14);
      }
      iVar12 = inet_addr(pcVar14);
    }
  }
  return iVar12;
}

Assistant:

extern int
libcmmulticast_LTX_writev_func(CMtrans_services svc, mcast_conn_data_ptr mcd, struct iovec *iov, int iovcnt, attr_list attrs)
{
    SOCKET fd = mcd->output_fd;
#ifndef _MSC_VER
    // no real equivalent on windows
    struct sockaddr_in addr = mcd->output_addr;
    struct msghdr msg;
    svc->trace_out(mcd->mtd->cm, "CMMcast writev of %d vectors on fd %d",
		   iovcnt, fd);
    memset(&msg, 0, sizeof(msg));
    msg.msg_name = (void*)&addr;
    msg.msg_namelen = sizeof(addr);
    msg.msg_iov = &iov[0];
    msg.msg_iovlen = iovcnt;
    if (sendmsg(fd, &msg, 0) < 0) {
	perror("write sendmsg");
	exit(1);
    }
#endif
    if (mcd->my_addr.sin_port == 0) {
	unsigned int nl;
	int IP = get_self_ip_addr(NULL, svc);
	nl = sizeof(struct sockaddr_in);
	if (getsockname(fd, (struct sockaddr *) &mcd->my_addr, &nl) != 0)
	    perror("getsockname");


	mcd->my_addr.sin_addr.s_addr = htonl(IP);
    }
    return iovcnt;
}